

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::basic_csv_reader<char,jsoncons::stream_source<char>,std::allocator<char>>::
basic_csv_reader<std::__cxx11::stringstream&>
          (basic_csv_reader<char,jsoncons::stream_source<char>,std::allocator<char>> *this,
          basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          basic_json_visitor<char> *visitor,basic_csv_decode_options<char> *options,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *err_handler,
          allocator<char> *alloc)

{
  _Any_data local_50;
  _Manager_type local_40;
  
  *(undefined ***)this = &PTR__basic_json_visitor_00b58ac8;
  stream_source<char>::stream_source
            ((stream_source<char> *)(this + 8),
             (basic_istream<char,_std::char_traits<char>_> *)source,0x4000);
  this[0x1a0] = (basic_csv_reader<char,jsoncons::stream_source<char>,std::allocator<char>>)0x1;
  *(basic_json_visitor<char> **)(this + 0x1a8) = visitor;
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)&local_50,
             err_handler);
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            ((basic_csv_parser<char,_std::allocator<char>_> *)(this + 0x1b0),options,
             (function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)&local_50,
             alloc);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return;
}

Assistant:

basic_csv_reader(Sourceable&& source,
                         basic_json_visitor<CharT>& visitor,
                         const basic_csv_decode_options<CharT>& options,
                         std::function<bool(csv_errc,const ser_context&)> err_handler, 
                         const Allocator& alloc = Allocator())
           : source_(std::forward<Sourceable>(source)),
             visitor_(visitor),
             parser_(options, err_handler, alloc)
             
        {
        }